

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

bool __thiscall
despot::BaseTag::Step(BaseTag *this,State *s,double random_num,ACT_TYPE action,double *reward)

{
  long lVar1;
  double *pdVar2;
  bool bVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  
  if (action == 4) {
    lVar5 = (long)*(int *)(s + 0xc);
    if ((this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5] ==
        (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5]) {
      *reward = TAG_REWARD;
      bVar3 = true;
      goto LAB_00111f16;
    }
    *reward = -TAG_REWARD;
  }
  else {
    *reward = -1.0;
    lVar5 = (long)*(int *)(s + 0xc);
  }
  bVar3 = false;
LAB_00111f16:
  lVar5 = *(long *)&(this->transition_probabilities_).
                    super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar5].
                    super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  lVar1 = *(long *)(lVar5 + (long)action * 0x18);
  lVar5 = (*(long *)(lVar5 + 8 + (long)action * 0x18) - lVar1 >> 5) + 1;
  dVar6 = 0.0;
  pdVar2 = (double *)(lVar1 + 0x18);
  do {
    pdVar4 = pdVar2;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return bVar3;
    }
    dVar6 = dVar6 + *pdVar4;
    pdVar2 = pdVar4 + 4;
  } while (dVar6 < random_num);
  *(undefined4 *)(s + 0xc) = *(undefined4 *)((long)pdVar4 + -0xc);
  return bVar3;
}

Assistant:

bool BaseTag::Step(State& s, double random_num, ACT_TYPE action,
	double& reward) const {
	TagState& state = static_cast<TagState&>(s);

	bool terminal = false;
	if (action == TagAction()) {
		if (rob_[state.state_id] == opp_[state.state_id]) {
			reward = TAG_REWARD;
			terminal = true;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}

	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			state.state_id = next.state_id;
			break;
		}
	}

	return terminal;
}